

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

void chacha(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out,size_t inlen,size_t rounds)

{
  chacha_state S;
  size_t in_stack_00000378;
  uint8_t *in_stack_00000380;
  uint8_t *in_stack_00000388;
  chacha_state_internal *in_stack_00000390;
  size_t in_stack_ffffffffffffff48;
  chacha_iv *in_stack_ffffffffffffff50;
  chacha_key *in_stack_ffffffffffffff58;
  chacha_state *in_stack_ffffffffffffff60;
  
  chacha_init(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48);
  chacha_consume(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378);
  return;
}

Assistant:

void
chacha(const chacha_key *key, const chacha_iv *iv, const uint8_t *in, uint8_t *out, size_t inlen, size_t rounds) {
    chacha_state S;
    chacha_init(&S, key, iv, rounds);
    chacha_consume((chacha_state_internal *)&S, in, out, inlen);
}